

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O2

void __thiscall ASTree::ASTree(ASTree *this)

{
  allocator<char> local_12;
  allocator_type local_11;
  
  std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector
            (&this->subtrees,(initializer_list<ASTree_*>)ZEXT816(0),&local_11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->root,"",&local_12);
  this->parent = (ASTree *)0x0;
  return;
}

Assistant:

ASTree::ASTree() : root(""), parent(nullptr), subtrees({}) {

}